

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O2

Aig_Man_t * Aig_ManDupRepr(Aig_Man_t *p,int fOrdered)

{
  Vec_Int_t *pVVar1;
  Aig_Man_t *pNew;
  char *pcVar2;
  Vec_Int_t *pVVar3;
  int *__dest;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *p1;
  size_t __size;
  int iVar7;
  
  pNew = Aig_ManStart(p->vObjs->nSize);
  pcVar2 = Abc_UtilStrsav(p->pName);
  pNew->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  pNew->pSpec = pcVar2;
  iVar7 = p->nBarBufs;
  pNew->nConstrs = p->nConstrs;
  pNew->nBarBufs = iVar7;
  pVVar1 = p->vFlopNums;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    iVar7 = pVVar1->nSize;
    pVVar3->nSize = iVar7;
    pVVar3->nCap = iVar7;
    if ((long)iVar7 == 0) {
      __size = 0;
      __dest = (int *)0x0;
    }
    else {
      __size = (long)iVar7 << 2;
      __dest = (int *)malloc(__size);
    }
    pVVar3->pArray = __dest;
    memcpy(__dest,pVVar1->pArray,__size);
    pNew->vFlopNums = pVVar3;
  }
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pNew->pConst1;
  for (iVar7 = 0; iVar7 < p->vCis->nSize; iVar7 = iVar7 + 1) {
    pvVar4 = Vec_PtrEntry(p->vCis,iVar7);
    pAVar5 = Aig_ObjCreateCi(pNew);
    *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar5;
  }
  if (fOrdered == 0) {
    for (iVar7 = 0; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(p->vCos,iVar7);
      Aig_ManDupRepr_rec(pNew,p,(Aig_Obj_t *)(*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe));
    }
  }
  else {
    for (iVar7 = 0; iVar7 < p->vObjs->nSize; iVar7 = iVar7 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar7);
      if ((pAVar5 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar5->field_0x18 & 7) - 7)) {
        pAVar6 = Aig_ObjChild0Repr(p,pAVar5);
        p1 = Aig_ObjChild1Repr(p,pAVar5);
        pAVar6 = Aig_And(pNew,pAVar6,p1);
        (pAVar5->field_5).pData = pAVar6;
      }
    }
  }
  for (iVar7 = 0; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar7);
    pAVar5 = Aig_ObjChild0Repr(p,pAVar5);
    Aig_ObjCreateCo(pNew,pAVar5);
  }
  Aig_ManSetRegNum(pNew,p->nRegs);
  iVar7 = Aig_ManCheck(pNew);
  if (iVar7 == 0) {
    puts("Aig_ManDupRepr: Check has failed.");
  }
  return pNew;
}

Assistant:

Aig_Man_t * Aig_ManDupRepr( Aig_Man_t * p, int fOrdered )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    // start the HOP package
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // map the const and primary inputs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi(pNew);
//    Aig_ManForEachCi( p, pObj, i )
//        pObj->pData = Aig_ObjGetRepr( p, pObj );
    // map the internal nodes
    if ( fOrdered )
    {
        Aig_ManForEachNode( p, pObj, i )
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Repr(p, pObj), Aig_ObjChild1Repr(p, pObj) );
    }
    else
    {
//        Aig_ManForEachObj( p, pObj, i )
//            if ( p->pReprs[i] )
//                printf( "Substituting %d for %d.\n", p->pReprs[i]->Id, pObj->Id );

        Aig_ManForEachCo( p, pObj, i )
            Aig_ManDupRepr_rec( pNew, p, Aig_ObjFanin0(pObj) );
    }
    // transfer the POs
    Aig_ManForEachCo( p, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Repr(p, pObj) );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the new manager
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupRepr: Check has failed.\n" );
    return pNew;
}